

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O1

void metrics_routine_cb(void *arg)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *unaff_RBX;
  long *plVar3;
  int64_t eval_b;
  int64_t eval_a;
  int cntr;
  uv_timer_t timer;
  uv_loop_t loop;
  long lStack_4e0;
  long lStack_4d8;
  int iStack_4cc;
  long alStack_4c8 [16];
  int *apiStack_448 [15];
  code *pcStack_3d0;
  undefined8 local_3c0;
  long local_3b8;
  int local_3ac;
  int *local_3a8 [15];
  undefined1 local_330 [808];
  
  local_3a8[0] = &local_3ac;
  local_3ac = 0;
  pcStack_3d0 = (code *)0x1acc01;
  iVar1 = uv_loop_init(local_330);
  local_3b8 = (long)iVar1;
  local_3c0 = 0;
  if (local_3b8 == 0) {
    pcStack_3d0 = (code *)0x1acc35;
    iVar1 = uv_loop_configure(local_330,1);
    local_3b8 = (long)iVar1;
    local_3c0 = 0;
    if (local_3b8 != 0) goto LAB_001acd9b;
    pcStack_3d0 = (code *)0x1acc67;
    iVar1 = uv_timer_init(local_330,local_3a8);
    local_3b8 = (long)iVar1;
    local_3c0 = 0;
    if (local_3b8 != 0) goto LAB_001acdaa;
    pcStack_3d0 = (code *)0x1acc9f;
    iVar1 = uv_timer_start(local_3a8,timer_spin_cb,1000,0);
    local_3b8 = (long)iVar1;
    local_3c0 = 0;
    if (local_3b8 != 0) goto LAB_001acdb9;
    pcStack_3d0 = (code *)0x1accce;
    iVar1 = uv_run(local_330,0);
    local_3b8 = (long)iVar1;
    local_3c0 = 0;
    if (local_3b8 != 0) goto LAB_001acdc8;
    local_3b8 = (long)local_3ac;
    local_3c0 = 0;
    if (local_3b8 < 1) goto LAB_001acdd7;
    pcStack_3d0 = (code *)0x1acd1e;
    local_3b8 = uv_metrics_idle_time(local_330);
    local_3c0 = 500000000;
    if (local_3b8 < 500000000) goto LAB_001acde6;
    unaff_RBX = local_330;
    pcStack_3d0 = (code *)0x1acd55;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_3d0 = (code *)0x1acd5f;
    uv_run(unaff_RBX,0);
    pcStack_3d0 = (code *)0x1acd67;
    iVar1 = uv_loop_close(unaff_RBX);
    local_3b8 = (long)iVar1;
    local_3c0 = 0;
    if (local_3b8 == 0) {
      return;
    }
  }
  else {
    pcStack_3d0 = (code *)0x1acd9b;
    metrics_routine_cb_cold_1();
LAB_001acd9b:
    pcStack_3d0 = (code *)0x1acdaa;
    metrics_routine_cb_cold_2();
LAB_001acdaa:
    pcStack_3d0 = (code *)0x1acdb9;
    metrics_routine_cb_cold_3();
LAB_001acdb9:
    pcStack_3d0 = (code *)0x1acdc8;
    metrics_routine_cb_cold_4();
LAB_001acdc8:
    pcStack_3d0 = (code *)0x1acdd7;
    metrics_routine_cb_cold_5();
LAB_001acdd7:
    pcStack_3d0 = (code *)0x1acde6;
    metrics_routine_cb_cold_6();
LAB_001acde6:
    pcStack_3d0 = (code *)0x1acdf5;
    metrics_routine_cb_cold_8();
  }
  pcStack_3d0 = run_test_metrics_idle_time_zero;
  metrics_routine_cb_cold_7();
  plVar3 = &lStack_4e0;
  apiStack_448[0] = &iStack_4cc;
  iStack_4cc = 0;
  pcStack_3d0 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_configure(uVar2,1);
  alStack_4c8[0] = (long)iVar1;
  lStack_4e0 = 0;
  if (alStack_4c8[0] == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,apiStack_448);
    alStack_4c8[0] = (long)iVar1;
    lStack_4e0 = 0;
    if (alStack_4c8[0] != 0) goto LAB_001acfea;
    iVar1 = uv_timer_start(apiStack_448,timer_noop_cb,0,0);
    alStack_4c8[0] = (long)iVar1;
    lStack_4e0 = 0;
    if (alStack_4c8[0] != 0) goto LAB_001acff7;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    alStack_4c8[0] = (long)iVar1;
    lStack_4e0 = 0;
    if (alStack_4c8[0] != 0) goto LAB_001ad004;
    alStack_4c8[0] = (long)iStack_4cc;
    lStack_4e0 = 0;
    if (alStack_4c8[0] < 1) goto LAB_001ad011;
    uVar2 = uv_default_loop();
    alStack_4c8[0] = uv_metrics_idle_time(uVar2);
    lStack_4e0 = 0;
    if (alStack_4c8[0] != 0) goto LAB_001ad01e;
    uVar2 = uv_default_loop();
    iVar1 = uv_metrics_info(uVar2,alStack_4c8);
    lStack_4e0 = (long)iVar1;
    lStack_4d8 = 0;
    if (lStack_4e0 != 0) goto LAB_001ad02b;
    lStack_4e0 = (long)iStack_4cc;
    lStack_4d8 = alStack_4c8[0];
    if (lStack_4e0 == alStack_4c8[0]) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_4e0 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      lStack_4d8 = (long)iVar1;
      if (lStack_4e0 == lStack_4d8) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001ad045;
    }
  }
  else {
    run_test_metrics_idle_time_zero_cold_1();
LAB_001acfea:
    run_test_metrics_idle_time_zero_cold_2();
LAB_001acff7:
    run_test_metrics_idle_time_zero_cold_3();
LAB_001ad004:
    run_test_metrics_idle_time_zero_cold_4();
LAB_001ad011:
    run_test_metrics_idle_time_zero_cold_5();
LAB_001ad01e:
    run_test_metrics_idle_time_zero_cold_6();
LAB_001ad02b:
    run_test_metrics_idle_time_zero_cold_7();
  }
  run_test_metrics_idle_time_zero_cold_8();
LAB_001ad045:
  run_test_metrics_idle_time_zero_cold_9();
  *(int *)*plVar3 = *(int *)*plVar3 + 1;
  return;
}

Assistant:

static void metrics_routine_cb(void* arg) {
  const uint64_t timeout = 1000;
  uv_loop_t loop;
  uv_timer_t timer;
  uint64_t idle_time;
  int cntr;

  cntr = 0;
  timer.data = &cntr;

  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_loop_configure(&loop, UV_METRICS_IDLE_TIME));
  ASSERT_OK(uv_timer_init(&loop, &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_spin_cb, timeout, 0));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT_GT(cntr, 0);

  idle_time = uv_metrics_idle_time(&loop);

  /* Only checking that idle time is greater than the lower bound since there
   * may have been thread contention, causing the event loop to be delayed in
   * the idle phase longer than expected.
   */
  ASSERT_GE(idle_time, (timeout - 500) * UV_NS_TO_MS);

  close_loop(&loop);
  ASSERT_OK(uv_loop_close(&loop));
}